

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O3

optional<pbrt::CameraRayDifferential> *
pbrt::CameraBase::GenerateRayDifferential
          (optional<pbrt::CameraRayDifferential> *__return_storage_ptr__,CameraHandle *camera,
          CameraSample *sample,SampledWavelengths *lambda)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined4 uVar4;
  undefined1 auVar3 [16];
  undefined4 uVar5;
  Float FVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar10;
  ulong uVar9;
  float fVar11;
  float fVar12;
  undefined1 auVar13 [16];
  Tuple2<pbrt::Point2,_float> TVar14;
  CameraSample sample_00;
  CameraSample sample_01;
  CameraSample sample_02;
  CameraSample sample_03;
  CameraSample sample_04;
  CameraSample sample_05;
  CameraSample sample_06;
  CameraSample sample_07;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  SampledWavelengths *lambda_00;
  PerspectiveCamera *pPVar18;
  long lVar19;
  byte bVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined4 uStack_164;
  undefined8 uStack_160;
  undefined4 uStack_158;
  byte local_14c;
  float local_148 [4];
  aligned_storage_t<sizeof(pbrt::CameraRay),_alignof(pbrt::CameraRay)> local_138;
  char local_100;
  optional<pbrt::CameraRayDifferential> *local_f0;
  undefined1 local_e8 [16];
  anon_struct_8_0_00000001_for___align local_d8;
  undefined8 uStack_d0;
  undefined1 local_c8 [16];
  undefined8 local_b0;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  aligned_storage_t<sizeof(pbrt::CameraRay),_alignof(pbrt::CameraRay)> local_78;
  char local_40;
  
  uVar8 = sample->time;
  uVar10 = sample->weight;
  local_138.__align =
       (anon_struct_8_0_00000001_for___align)(sample->pFilm).super_Tuple2<pbrt::Point2,_float>;
  TVar14 = (sample->pLens).super_Tuple2<pbrt::Point2,_float>;
  lambda_00 = (SampledWavelengths *)CONCAT71((int7)((ulong)sample >> 8),0x30);
  local_138._8_4_ = TVar14.x;
  local_138._12_4_ = TVar14.y;
  uVar9 = (camera->
          super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
          ).bits;
  pPVar18 = (PerspectiveCamera *)(uVar9 & 0xffffffffffff);
  local_138._16_4_ = uVar8;
  local_138._20_4_ = uVar10;
  if ((ushort)(uVar9 >> 0x30) < 3) {
    if ((uVar9 & 0x3000000000000) == 0x2000000000000) {
      OrthographicCamera::GenerateRay
                ((optional<pbrt::CameraRay> *)&local_78.__align,(OrthographicCamera *)pPVar18,
                 *sample,lambda_00);
    }
    else {
      PerspectiveCamera::GenerateRay
                ((optional<pbrt::CameraRay> *)&local_78.__align,pPVar18,*sample,lambda_00);
    }
  }
  else if ((uVar9 & 0xfffe000000000000) == 0x2000000000000) {
    SphericalCamera::GenerateRay
              ((optional<pbrt::CameraRay> *)&local_78.__align,(SphericalCamera *)pPVar18,*sample,
               lambda_00);
  }
  else {
    RealisticCamera::GenerateRay
              ((optional<pbrt::CameraRay> *)&local_78.__align,(RealisticCamera *)pPVar18,*sample,
               lambda_00);
  }
  local_f0 = __return_storage_ptr__;
  if (local_40 == '\0') {
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x40) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x48) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x50) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x58) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x60) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x68) = 0;
    *(undefined8 *)&__return_storage_ptr__->set = 0;
    (__return_storage_ptr__->optionalValue).__align = (anon_struct_8_0_00000001_for___align)0x0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 8) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x10) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x18) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0;
    *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x38) = 0;
  }
  else {
    local_e8._8_8_ = 0;
    local_e8._0_8_ = local_78._16_8_;
    lVar19 = 0;
    local_148[3] = (float)local_78._24_4_;
    local_d8 = local_78.__align;
    uStack_d0 = local_78._8_8_;
    local_148[0] = 0.05;
    local_148[1] = -0.05;
    local_b0 = local_78._32_8_;
    do {
      FVar6 = sample->weight;
      local_c8 = ZEXT416((uint)*(float *)((long)local_148 + lVar19));
      fVar11 = *(float *)((long)local_148 + lVar19) +
               (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.x;
      auVar3 = *(undefined1 (*) [16])&(sample->pFilm).super_Tuple2<pbrt::Point2,_float>.y;
      uStack_164 = auVar3._0_4_;
      uStack_160 = auVar3._4_8_;
      uStack_158 = auVar3._12_4_;
      uVar9 = (camera->
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              ).bits;
      pPVar18 = (PerspectiveCamera *)(uVar9 & 0xffffffffffff);
      if (uVar9 < 0x3000000000000) {
        if ((uVar9 & 0x3000000000000) == 0x2000000000000) {
          sample_00.weight = FVar6;
          sample_00.time = (Float)uStack_158;
          sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_164;
          sample_00.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar11;
          sample_00.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(undefined4)uStack_160;
          sample_00.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_160._4_4_;
          OrthographicCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_138.__align,(OrthographicCamera *)pPVar18,
                     sample_00,(SampledWavelengths *)0x2000000000000);
        }
        else {
          sample_02.weight = FVar6;
          sample_02.time = (Float)uStack_158;
          sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_164;
          sample_02.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar11;
          sample_02.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(undefined4)uStack_160;
          sample_02.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_160._4_4_;
          PerspectiveCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_138.__align,pPVar18,sample_02,
                     (SampledWavelengths *)0x2000000000000);
        }
      }
      else if ((uVar9 & 0xfffe000000000000) == 0x2000000000000) {
        sample_01.weight = FVar6;
        sample_01.time = (Float)uStack_158;
        sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_164;
        sample_01.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar11;
        sample_01.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(undefined4)uStack_160;
        sample_01.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_160._4_4_;
        SphericalCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_138.__align,(SphericalCamera *)pPVar18,
                   sample_01,(SampledWavelengths *)0x2000000000000);
      }
      else {
        sample_03.weight = FVar6;
        sample_03.time = (Float)uStack_158;
        sample_03.pFilm.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_164;
        sample_03.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar11;
        sample_03.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(undefined4)uStack_160;
        sample_03.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)uStack_160._4_4_;
        RealisticCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_138.__align,(RealisticCamera *)pPVar18,
                   sample_03,(SampledWavelengths *)0x2000000000000);
      }
      if (local_100 == '\x01') {
        auVar3._4_12_ = local_138._24_12_;
        auVar3._0_4_ = local_138._20_4_;
        auVar29._8_8_ = 0;
        auVar29._0_8_ = local_138.__align;
        auVar24._4_4_ = local_138._16_4_;
        auVar24._0_4_ = local_138._12_4_;
        auVar24._8_8_ = 0;
        auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)local_138._8_4_),0x10);
        auVar13._8_8_ = uStack_d0;
        auVar13._0_8_ = local_d8;
        auVar23._4_4_ = local_c8._0_4_;
        auVar23._0_4_ = local_c8._0_4_;
        auVar23._8_4_ = local_c8._0_4_;
        auVar23._12_4_ = local_c8._0_4_;
        local_14c = 1;
        auVar22 = vpermi2ps_avx512vl(_DAT_02919720,local_e8,auVar13);
        auVar21 = vpermi2ps_avx512vl(_DAT_02919710,auVar13,local_e8);
        auVar13 = vsubps_avx(auVar29,auVar13);
        auVar24 = vsubps_avx(auVar24,auVar22);
        auVar29 = vsubps_avx(auVar3,auVar21);
        auVar3 = vdivps_avx(auVar13,auVar23);
        auVar13 = vdivps_avx(auVar24,auVar23);
        auVar24 = vdivps_avx(auVar29,auVar23);
        local_88 = local_d8._0_4_ + auVar3._0_4_;
        fStack_84 = local_d8._4_4_ + auVar3._4_4_;
        fStack_80 = (float)uStack_d0 + auVar3._8_4_;
        fStack_7c = (float)((ulong)uStack_d0 >> 0x20) + auVar3._12_4_;
        local_98 = auVar22._0_4_ + auVar13._0_4_;
        fStack_94 = auVar22._4_4_ + auVar13._4_4_;
        fStack_90 = auVar22._8_4_ + auVar13._8_4_;
        fStack_8c = auVar22._12_4_ + auVar13._12_4_;
        local_a8 = auVar21._0_4_ + auVar24._0_4_;
        fStack_a4 = auVar21._4_4_ + auVar24._4_4_;
        fStack_a0 = auVar21._8_4_ + auVar24._8_4_;
        fStack_9c = auVar21._12_4_ + auVar24._12_4_;
        goto LAB_0038bd9b;
      }
      lVar19 = lVar19 + 4;
    } while (lVar19 != 8);
    local_a8 = 0.0;
    fStack_a4 = 0.0;
    fStack_a0 = 0.0;
    fStack_9c = 0.0;
    local_14c = 0;
    local_88 = 0.0;
    fStack_84 = 0.0;
    fStack_80 = 0.0;
    fStack_7c = 0.0;
    local_98 = 0.0;
    fStack_94 = 0.0;
    fStack_90 = 0.0;
    fStack_8c = 0.0;
LAB_0038bd9b:
    lVar19 = 0;
    local_148[0] = 0.05;
    local_148[1] = -0.05;
    do {
      fVar11 = (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.x;
      uVar2 = sample->pLens;
      uVar4 = sample->time;
      uVar5 = sample->weight;
      sample_07.weight = (Float)uVar5;
      sample_07.time = (Float)uVar4;
      local_c8 = ZEXT416((uint)*(float *)((long)local_148 + lVar19));
      fVar12 = *(float *)((long)local_148 + lVar19) +
               (sample->pFilm).super_Tuple2<pbrt::Point2,_float>.y;
      uVar9 = (camera->
              super_TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
              ).bits;
      pPVar18 = (PerspectiveCamera *)(uVar9 & 0xffffffffffff);
      if (uVar9 < 0x3000000000000) {
        if ((uVar9 & 0x3000000000000) == 0x2000000000000) {
          sample_04.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar12;
          sample_04.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar11;
          sample_04.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)uVar2;
          sample_04.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
          sample_04.time = (Float)uVar4;
          sample_04.weight = (Float)uVar5;
          OrthographicCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_138.__align,(OrthographicCamera *)pPVar18,
                     sample_04,(SampledWavelengths *)0x2000000000000);
        }
        else {
          sample_06.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar12;
          sample_06.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar11;
          sample_06.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)uVar2;
          sample_06.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
          sample_06.time = (Float)uVar4;
          sample_06.weight = (Float)uVar5;
          PerspectiveCamera::GenerateRay
                    ((optional<pbrt::CameraRay> *)&local_138.__align,pPVar18,sample_06,
                     (SampledWavelengths *)0x2000000000000);
        }
      }
      else if ((uVar9 & 0xfffe000000000000) == 0x2000000000000) {
        sample_05.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar12;
        sample_05.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar11;
        sample_05.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)uVar2;
        sample_05.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
        sample_05.time = (Float)uVar4;
        sample_05.weight = (Float)uVar5;
        SphericalCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_138.__align,(SphericalCamera *)pPVar18,
                   sample_05,(SampledWavelengths *)0x2000000000000);
      }
      else {
        sample_07.pFilm.super_Tuple2<pbrt::Point2,_float>.y = fVar12;
        sample_07.pFilm.super_Tuple2<pbrt::Point2,_float>.x = fVar11;
        sample_07.pLens.super_Tuple2<pbrt::Point2,_float>.x = (float)(int)uVar2;
        sample_07.pLens.super_Tuple2<pbrt::Point2,_float>.y = (float)(int)((ulong)uVar2 >> 0x20);
        RealisticCamera::GenerateRay
                  ((optional<pbrt::CameraRay> *)&local_138.__align,(RealisticCamera *)pPVar18,
                   sample_07,(SampledWavelengths *)0x2000000000000);
      }
      bVar20 = 0;
      if (local_100 == '\x01') {
        auVar22._4_12_ = local_138._24_12_;
        auVar22._0_4_ = local_138._20_4_;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_138.__align;
        auVar28._4_4_ = local_138._16_4_;
        auVar28._0_4_ = local_138._12_4_;
        auVar28._8_8_ = 0;
        auVar3 = vinsertps_avx(auVar22,ZEXT416((uint)local_138._8_4_),0x10);
        bVar20 = 1;
        auVar21._8_8_ = uStack_d0;
        auVar21._0_8_ = local_d8;
        auVar31._4_4_ = local_c8._0_4_;
        auVar31._0_4_ = local_c8._0_4_;
        auVar31._8_4_ = local_c8._0_4_;
        auVar31._12_4_ = local_c8._0_4_;
        auVar22 = vpermi2ps_avx512vl(_DAT_02919710,auVar21,local_e8);
        auVar23 = vpermi2ps_avx512vl(_DAT_02919720,local_e8,auVar21);
        auVar13 = vsubps_avx(auVar26,auVar21);
        auVar24 = vsubps_avx(auVar3,auVar22);
        auVar29 = vsubps_avx(auVar28,auVar23);
        auVar3 = vdivps_avx(auVar13,auVar31);
        auVar13 = vdivps_avx(auVar24,auVar31);
        auVar24 = vdivps_avx(auVar29,auVar31);
        auVar25._0_4_ = local_d8._0_4_ + auVar3._0_4_;
        auVar25._4_4_ = local_d8._4_4_ + auVar3._4_4_;
        auVar25._8_4_ = (float)uStack_d0 + auVar3._8_4_;
        auVar25._12_4_ = (float)((ulong)uStack_d0 >> 0x20) + auVar3._12_4_;
        auVar27._0_4_ = auVar23._0_4_ + auVar24._0_4_;
        auVar27._4_4_ = auVar23._4_4_ + auVar24._4_4_;
        auVar27._8_4_ = auVar23._8_4_ + auVar24._8_4_;
        auVar27._12_4_ = auVar23._12_4_ + auVar24._12_4_;
        auVar30._0_4_ = auVar22._0_4_ + auVar13._0_4_;
        auVar30._4_4_ = auVar22._4_4_ + auVar13._4_4_;
        auVar30._8_4_ = auVar22._8_4_ + auVar13._8_4_;
        auVar30._12_4_ = auVar22._12_4_ + auVar13._12_4_;
        goto LAB_0038bf9a;
      }
      lVar19 = lVar19 + 4;
    } while (lVar19 != 8);
    auVar25 = ZEXT816(0) << 0x40;
    auVar27 = ZEXT816(0) << 0x40;
    auVar30 = ZEXT816(0) << 0x40;
LAB_0038bf9a:
    auVar32._8_8_ = uStack_d0;
    auVar32._0_8_ = local_d8;
    auVar17._4_4_ = fStack_84;
    auVar17._0_4_ = local_88;
    auVar17._8_4_ = fStack_80;
    auVar17._12_4_ = fStack_7c;
    local_f0->set = true;
    *(undefined1 (*) [16])&local_f0->optionalValue = auVar32;
    uVar1 = vmovlps_avx(local_e8);
    *(undefined8 *)((long)&local_f0->optionalValue + 0x10) = uVar1;
    auVar16._4_4_ = fStack_94;
    auVar16._0_4_ = local_98;
    auVar16._8_4_ = fStack_90;
    auVar16._12_4_ = fStack_8c;
    *(float *)((long)&local_f0->optionalValue + 0x18) = local_148[3];
    *(undefined8 *)((long)&local_f0->optionalValue + 0x20) = local_b0;
    (local_f0->optionalValue).__data[0x28] = local_14c & bVar20;
    uVar1 = vmovlps_avx(auVar17);
    *(undefined8 *)((long)&local_f0->optionalValue + 0x2c) = uVar1;
    auVar15._4_4_ = fStack_a4;
    auVar15._0_4_ = local_a8;
    auVar15._8_4_ = fStack_a0;
    auVar15._12_4_ = fStack_9c;
    uVar7 = vextractps_avx(auVar15,1);
    *(undefined4 *)((long)&local_f0->optionalValue + 0x34) = uVar7;
    uVar1 = vmovlps_avx(auVar25);
    *(undefined8 *)((long)&local_f0->optionalValue + 0x38) = uVar1;
    uVar7 = vextractps_avx(auVar30,1);
    *(undefined4 *)((long)&local_f0->optionalValue + 0x40) = uVar7;
    uVar1 = vmovlps_avx(auVar16);
    *(undefined8 *)((long)&local_f0->optionalValue + 0x44) = uVar1;
    *(float *)((long)&local_f0->optionalValue + 0x4c) = local_a8;
    uVar1 = vmovlps_avx(auVar27);
    *(undefined8 *)((long)&local_f0->optionalValue + 0x50) = uVar1;
    *(int *)((long)&local_f0->optionalValue + 0x58) = auVar30._0_4_;
    *(undefined8 *)((long)&local_f0->optionalValue + 0x60) = local_78._40_8_;
    *(undefined8 *)((long)&local_f0->optionalValue + 0x68) = local_78._48_8_;
  }
  return local_f0;
}

Assistant:

pstd::optional<CameraRayDifferential> CameraBase::GenerateRayDifferential(
    CameraHandle camera, const CameraSample &sample, SampledWavelengths &lambda) {
    // Generate regular camera ray _cr_ for ray differential
    pstd::optional<CameraRay> cr = camera.GenerateRay(sample, lambda);
    if (!cr)
        return {};
    RayDifferential rd(cr->ray);

    // Find camera ray after shifting one pixel in the $x$ direction
    pstd::optional<CameraRay> rx;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.x += eps;
        // Try to generate ray with _sshift_ and compute $x$ differential
        if (rx = camera.GenerateRay(sshift, lambda); rx) {
            rd.rxOrigin = rd.o + (rx->ray.o - rd.o) / eps;
            rd.rxDirection = rd.d + (rx->ray.d - rd.d) / eps;
            break;
        }
    }

    // Find camera ray after shifting one pixel in the $y$ direction
    pstd::optional<CameraRay> ry;
    for (Float eps : {.05f, -.05f}) {
        CameraSample sshift = sample;
        sshift.pFilm.y += eps;
        if (ry = camera.GenerateRay(sshift, lambda); ry) {
            rd.ryOrigin = rd.o + (ry->ray.o - rd.o) / eps;
            rd.ryDirection = rd.d + (ry->ray.d - rd.d) / eps;
            break;
        }
    }

    // Return approximate ray differential and weight
    rd.hasDifferentials = rx && ry;
    return CameraRayDifferential{rd, cr->weight};
}